

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O1

void T_UConverter_toUnicode_UTF32_LE_OFFSET_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  UChar UVar10;
  uint uVar11;
  UChar *pUVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  
  pUVar2 = args->converter;
  pbVar5 = (byte *)args->source;
  pUVar12 = args->target;
  piVar8 = args->offsets;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  uVar6 = (uint)pUVar2->toULength;
  iVar9 = 0;
  if (pUVar4 <= pUVar12 || pUVar2->toULength < '\x01') goto LAB_002c879a;
  pUVar2->toULength = '\0';
  uVar11 = pUVar2->toUnicodeStatus - 1;
  pUVar2->toUnicodeStatus = 0;
  iVar9 = 0;
  do {
    if (uVar6 < 4) {
      uVar13 = (ulong)uVar6;
      iVar7 = uVar6 << 3;
      do {
        if (pbVar3 <= pbVar5) {
          pUVar2 = args->converter;
          pUVar2->toUnicodeStatus = uVar11 + 1;
          pUVar2->toULength = (int8_t)uVar13;
          goto LAB_002c8881;
        }
        bVar1 = *pbVar5;
        pUVar2->toUBytes[uVar13] = bVar1;
        uVar11 = uVar11 | (uint)bVar1 << ((byte)iVar7 & 0x1f);
        pbVar5 = pbVar5 + 1;
        uVar13 = uVar13 + 1;
        iVar7 = iVar7 + 8;
      } while (uVar13 != 4);
      uVar6 = 4;
    }
    if ((0x10ffff < uVar11) || ((uVar11 & 0x1ff800) == 0xd800)) {
      args->converter->toULength = (int8_t)uVar6;
      *err = U_ILLEGAL_CHAR_FOUND;
      break;
    }
    if (uVar11 < 0x10000) {
      *pUVar12 = (UChar)uVar11;
      pUVar12 = pUVar12 + 1;
      lVar15 = 4;
      piVar14 = piVar8;
    }
    else {
      *pUVar12 = (short)(uVar11 >> 10) + L'ퟀ';
      piVar14 = piVar8 + 1;
      *piVar8 = iVar9;
      UVar10 = (UChar)uVar11 & 0x3ffU | 0xdc00;
      if (pUVar4 <= pUVar12 + 1) {
        pUVar2 = args->converter;
        pUVar2->UCharErrorBuffer[0] = UVar10;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        piVar8 = piVar14;
        pUVar12 = pUVar12 + 1;
        break;
      }
      pUVar12[1] = UVar10;
      pUVar12 = pUVar12 + 2;
      lVar15 = 8;
    }
    piVar8 = (int *)((long)piVar8 + lVar15);
    *piVar14 = iVar9;
    iVar9 = iVar9 + uVar6;
LAB_002c879a:
    if (pbVar3 <= pbVar5) break;
    uVar11 = 0;
    uVar6 = 0;
  } while (pUVar12 < pUVar4);
LAB_002c8881:
  if (((pbVar5 < pbVar3) && (pUVar4 <= pUVar12)) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    *err = U_BUFFER_OVERFLOW_ERROR;
  }
  args->target = pUVar12;
  args->source = (char *)pbVar5;
  args->offsets = piVar8;
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_toUnicode_UTF32_LE_OFFSET_LOGIC(UConverterToUnicodeArgs * args,
                                             UErrorCode * err)
{
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    int32_t *myOffsets = args->offsets;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = args->converter->toUBytes;
    uint32_t ch, i;
    int32_t offsetNum = 0;

    /* Restore state of current sequence */
    if (args->converter->toULength > 0 && myTarget < targetLimit)
    {
        i = args->converter->toULength;       /* restore # of bytes consumed */
        args->converter->toULength = 0;

        /* Stores the previously calculated ch from a previous call*/
        ch = args->converter->toUnicodeStatus - 1;
        args->converter->toUnicodeStatus = 0;
        goto morebytes;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        i = 0;
        ch = 0;
morebytes:
        while (i < sizeof(uint32_t))
        {
            if (mySource < sourceLimit)
            {
                ch |= ((uint8_t)(*mySource)) << (i * 8);
                toUBytes[i++] = (char) *(mySource++);
            }
            else
            {
                /* stores a partially calculated target*/
                /* + 1 to make 0 a valid character */
                args->converter->toUnicodeStatus = ch + 1;
                args->converter->toULength = (int8_t) i;
                goto donefornow;
            }
        }

        if (ch <= MAXIMUM_UTF && !U_IS_SURROGATE(ch))
        {
            /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
            if (ch <= MAXIMUM_UCS2) 
            {
                /* fits in 16 bits */
                *(myTarget++) = (UChar) ch;
                *(myOffsets++) = offsetNum;
            }
            else {
                /* write out the surrogates */
                *(myTarget++) = U16_LEAD(ch);
                *(myOffsets++) = offsetNum;
                ch = U16_TRAIL(ch);
                if (myTarget < targetLimit)
                {
                    *(myTarget++) = (UChar)ch;
                    *(myOffsets++) = offsetNum;
                }
                else
                {
                    /* Put in overflow buffer (not handled here) */
                    args->converter->UCharErrorBuffer[0] = (UChar) ch;
                    args->converter->UCharErrorBufferLength = 1;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
        }
        else
        {
            args->converter->toULength = (int8_t)i;
            *err = U_ILLEGAL_CHAR_FOUND;
            break;
        }
        offsetNum += i;
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
    args->offsets = myOffsets;
}